

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_for::dump(statement_for *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  _Elt_pointer ptVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  statement_base **ptr;
  _Elt_pointer ppsVar6;
  _Elt_pointer ppsVar7;
  _Map_pointer pppsVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginFor >\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Iterator = ",0xd);
  ptVar2 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = (long)ptVar2 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
  uVar3 = lVar4 >> 3;
  if ((long)uVar3 < 0) {
    uVar5 = lVar4 >> 9;
LAB_001d8536:
    ptVar2 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x40;
  }
  else if (0x3f < uVar3) {
    uVar5 = uVar3 >> 6;
    goto LAB_001d8536;
  }
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Condition = ",0x11);
  ptVar2 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = (long)ptVar2 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar3 = lVar4 + 1;
  if (lVar4 < -1) {
    uVar5 = (long)uVar3 >> 6;
LAB_001d85a6:
    ptVar2 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x40;
  }
  else {
    if (0x3f < uVar3) {
      uVar5 = uVar3 >> 6;
      goto LAB_001d85a6;
    }
    ptVar2 = ptVar2 + 1;
  }
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Increment = ",0x11);
  ptVar2 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = (long)ptVar2 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar3 = lVar4 + 2;
  if (lVar4 < -2) {
    uVar5 = (long)uVar3 >> 6;
  }
  else {
    if (uVar3 < 0x40) {
      ptVar2 = ptVar2 + 2;
      goto LAB_001d8625;
    }
    uVar5 = uVar3 >> 6;
  }
  ptVar2 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x40;
LAB_001d8625:
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Body >\n",0xc);
  ppsVar6 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar6 != ppsVar1) {
    ppsVar7 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar8 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar6)->_vptr_statement_base[5])(*ppsVar6,o);
      ppsVar6 = ppsVar6 + 1;
      if (ppsVar6 == ppsVar7) {
        ppsVar6 = pppsVar8[1];
        pppsVar8 = pppsVar8 + 1;
        ppsVar7 = ppsVar6 + 0x40;
      }
    } while (ppsVar6 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndFor >\n",0xb);
  return;
}

Assistant:

void statement_for::dump(std::ostream &o) const
	{
		o << "< BeginFor >\n";
		o << "< Iterator = ";
		compiler_type::dump_expr(mParallel[0].root(), o);
		o << " >\n< Condition = ";
		compiler_type::dump_expr(mParallel[1].root(), o);
		o << " >\n< Increment = ";
		compiler_type::dump_expr(mParallel[2].root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFor >\n";
	}